

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxv_basic_orix.cpp
# Opt level: O1

bool test(void)

{
  undefined4 in_EAX;
  Type (*paTVar1) [6000];
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  float fVar6;
  undefined4 uStack_28;
  float local_24;
  
  paTVar1 = mx;
  uVar4 = 0;
  bVar5 = false;
  while( true ) {
    fVar6 = 0.0;
    lVar3 = 0;
    do {
      fVar6 = fVar6 + *(float *)((long)*paTVar1 + lVar3) * *(float *)((long)v + lVar3);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 24000);
    fVar6 = fVar6 + 1.0;
    if ((fVar6 != result[uVar4]) || (NAN(fVar6) || NAN(result[uVar4]))) break;
    bVar5 = 0x176e < uVar4;
    uVar4 = uVar4 + 1;
    paTVar1 = paTVar1 + 1;
    if (uVar4 == 6000) {
      return bVar5;
    }
  }
  _uStack_28 = CONCAT44(fVar6,in_EAX);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at result ",0x10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar4);
  uStack_28 = CONCAT13(0x20,(undefined3)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_28 + 3),1);
  poVar2 = std::ostream::_M_insert<double>((double)local_24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!=",2);
  poVar2 = std::ostream::_M_insert<double>((double)result[uVar4]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return bVar5;
}

Assistant:

bool test()
{
  const Type *mxp = (const Type *)mx;
  const Type *vp  = (const Type *)v;
  const Type *rp  = (const Type *)result;
  
  for (int i = 0; i < M; i++) {
    Type f = (Type)0;
    for(int j = 0; j < N; j++)
      f += mxp[i * N + j] * vp[j];
    if ( (f + (Type)1) != rp[i]) {
      std::cerr << "Error at result " << i << ' ' << (f + (Type)1) << "!=" << rp[i] << std::endl;
      return false;
    }
  }
  
  return true;
}